

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O0

int Sfm_ObjRef_rec(Sfm_Ntk_t *p,int iObj)

{
  int iVar1;
  int local_2c;
  int Count;
  int Value;
  int iFanin;
  int i;
  int iObj_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjIsPi(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Sfm_ObjIsNode(p,iObj);
    if (iVar1 == 0) {
      __assert_fail("Sfm_ObjIsNode(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmWin.c"
                    ,0x32,"int Sfm_ObjRef_rec(Sfm_Ntk_t *, int)");
    }
    iVar1 = Sfm_ObjRefIncrement(p,iObj);
    if (iVar1 < 2) {
      if (iVar1 != 1) {
        __assert_fail("Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmWin.c"
                      ,0x36,"int Sfm_ObjRef_rec(Sfm_Ntk_t *, int)");
      }
      local_2c = 1;
      for (Value = 0; iVar1 = Sfm_ObjFaninNum(p,iObj), Value < iVar1; Value = Value + 1) {
        iVar1 = Sfm_ObjFanin(p,iObj,Value);
        iVar1 = Sfm_ObjRef_rec(p,iVar1);
        local_2c = iVar1 + local_2c;
      }
      p_local._4_4_ = local_2c;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the MFFC size.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sfm_ObjRef_rec( Sfm_Ntk_t * p, int iObj )
{
    int i, iFanin, Value, Count;
    if ( Sfm_ObjIsPi(p, iObj) )
        return 0;
    assert( Sfm_ObjIsNode(p, iObj) );
    Value = Sfm_ObjRefIncrement(p, iObj);
    if ( Value > 1 )
        return 0;
    assert( Value == 1 );
    Count = 1;
    Sfm_ObjForEachFanin( p, iObj, iFanin, i )
        Count += Sfm_ObjRef_rec( p, iFanin );
    return Count;
}